

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview_p.h
# Opt level: O2

void __thiscall QHeaderViewPrivate::prepareSectionSelected(QHeaderViewPrivate *this)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  qsizetype asize;
  
  bVar1 = QPointer::operator_cast_to_bool
                    ((QPointer *)&(this->super_QAbstractItemViewPrivate).selectionModel);
  if (bVar1) {
    cVar2 = QItemSelectionModel::hasSelection();
    if (cVar2 != '\0') {
      pcVar4 = (this->sectionSelected).d.d.ptr;
      if (pcVar4 == (char *)0x0) {
        pcVar4 = (char *)&QByteArray::_empty;
      }
      if (this->headerMode == InitialNoSectionMemoryUsage) {
        iVar3 = (int)this->countInNoSectionItemsMode;
      }
      else {
        iVar3 = (int)(this->sectionItems).d.size;
      }
      asize = (qsizetype)(iVar3 * 2);
      if ((this->sectionSelected).d.d.size * 8 - (long)*pcVar4 == asize) {
        asize = -1;
      }
      QBitArray::fill(&this->sectionSelected,false,asize);
      return;
    }
  }
  QByteArray::clear();
  return;
}

Assistant:

inline void prepareSectionSelected() {
        if (!selectionModel || !selectionModel->hasSelection())
            sectionSelected.clear();
        else if (sectionSelected.size() != sectionCount() * 2)
            sectionSelected.fill(false, sectionCount() * 2);
        else sectionSelected.fill(false);
    }